

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  cmCPackIFWPackage *package_1;
  _Self local_268;
  iterator pit;
  string local_258;
  allocator local_221;
  string local_220;
  char *local_200;
  char *option;
  cmCPackIFWPackage package;
  cmCPackIFWInstaller *this_local;
  
  package.Directory.field_2._8_8_ = this;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
          ::empty(&this->Packages);
  if ((bVar1) || (bVar1 = cmCPackIFWGenerator::IsOnePackage(this->Generator), bVar1)) {
    cmCPackIFWPackage::cmCPackIFWPackage((cmCPackIFWPackage *)&option);
    package.ForcedInstallation.field_2._8_8_ = this->Generator;
    package.Generator = (cmCPackIFWGenerator *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_220,"CPACK_IFW_PACKAGE_GROUP",&local_221);
    pcVar2 = GetOption(this,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    local_200 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      cmCPackIFWPackage::ConfigureFromOptions((cmCPackIFWPackage *)&option);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_258,pcVar2,(allocator *)((long)&pit._M_node + 7));
      cmCPackIFWPackage::ConfigureFromGroup((cmCPackIFWPackage *)&option,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pit._M_node + 7));
      std::__cxx11::string::operator=((string *)(package.Virtual.field_2._M_local_buf + 8),"true");
    }
    cmCPackIFWPackage::GeneratePackageFile((cmCPackIFWPackage *)&option);
    cmCPackIFWPackage::~cmCPackIFWPackage((cmCPackIFWPackage *)&option);
  }
  else {
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
         ::begin(&this->Packages);
    while( true ) {
      package_1 = (cmCPackIFWPackage *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>_>
                  ::end(&this->Packages);
      bVar1 = std::operator!=(&local_268,(_Self *)&package_1);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
               ::operator->(&local_268);
      cmCPackIFWPackage::GeneratePackageFile(ppVar3->second);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>_>
      ::operator++(&local_268);
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (Packages.empty() || Generator->IsOnePackage())
    {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = GetOption("CPACK_IFW_PACKAGE_GROUP"))
      {
      package.ConfigureFromGroup(option);
      package.ForcedInstallation = "true";
      }
    else
      {
      package.ConfigureFromOptions();
      }
    package.GeneratePackageFile();
    return;
    }

  // Generate packages meta information
  for(PackagesMap::iterator pit = Packages.begin();
      pit != Packages.end(); ++pit)
    {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}